

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaping_clipper.cpp
# Opt level: O0

void __thiscall shaping_clipper::generate_spread_table(shaping_clipper *this)

{
  float fVar1;
  int *piVar2;
  reference pvVar3;
  reference this_00;
  reference pvVar4;
  int iVar5;
  vector<float,_std::allocator<float>_> *this_01;
  double extraout_XMM0_Qa;
  double dVar6;
  float local_58;
  float local_54;
  int i;
  int next_bin;
  pair<int,_int> local_48;
  float local_40;
  float local_3c;
  int j_1;
  float value;
  float rel_idx_log;
  int j;
  float local_28;
  int end_bin;
  int start_bin;
  int base_idx;
  float sum;
  int increment;
  int bin;
  int table_index;
  shaping_clipper *this_local;
  
  increment = 0;
  base_idx = 1;
  sum = 0.0;
  _bin = this;
  while ((int)sum < this->num_psy_bins) {
    start_bin = 0;
    end_bin = increment * this->num_psy_bins;
    local_28 = (float)(((int)sum * 3) / 4);
    this_01 = (vector<float,_std::allocator<float>_> *)&this->num_psy_bins;
    rel_idx_log = (float)((((int)sum + 1) * 4 + 2) / 3);
    piVar2 = std::min<int>((int *)this_01,(int *)&rel_idx_log);
    j = *piVar2;
    for (value = local_28; iVar5 = (int)this_01, (int)value < j; value = (float)((int)value + 1)) {
      log(((double)(int)value + 0.5) / ((double)(int)sum + 0.5));
      std::abs(iVar5);
      j_1 = (int)(float)extraout_XMM0_Qa;
      if ((int)value < (int)sum) {
        dVar6 = exp((double)(-(float)j_1 * 80.0));
      }
      else {
        dVar6 = exp((double)(-(float)j_1 * 40.0));
      }
      local_3c = (float)dVar6;
      fVar1 = local_3c;
      start_bin = (int)(local_3c + (float)start_bin);
      this_01 = &this->spread_table;
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                         (this_01,(long)((end_bin + this->num_psy_bins / 2 + (int)value) - (int)sum)
                         );
      *pvVar3 = fVar1;
    }
    for (local_40 = local_28; iVar5 = start_bin, (int)local_40 < j;
        local_40 = (float)((int)local_40 + 1)) {
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&this->spread_table,
                          (long)((end_bin + this->num_psy_bins / 2 + (int)local_40) - (int)sum));
      *pvVar3 = *pvVar3 / (float)iVar5;
    }
    next_bin = (int)local_28 - (int)sum;
    i = j - (int)sum;
    local_48 = std::make_pair<int,int>(&next_bin,&i);
    this_00 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                        (&this->spread_table_range,(long)increment);
    std::pair<int,_int>::operator=(this_00,&local_48);
    if ((int)sum < 2) {
      local_54 = (float)((int)sum + 1);
    }
    else {
      if (((uint)sum & (int)sum - 1U) == 0) {
        base_idx = (int)sum / 2;
      }
      local_54 = (float)((int)sum + base_idx);
    }
    for (local_58 = sum; iVar5 = increment, (int)local_58 < (int)local_54;
        local_58 = (float)((int)local_58 + 1)) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->spread_table_index,(long)(int)local_58);
      *pvVar4 = iVar5;
    }
    increment = increment + 1;
    sum = local_54;
  }
  return;
}

Assistant:

void shaping_clipper::generate_spread_table() {
    // Calculate tent-shape function in log-log scale.

    // As an optimization, only consider bins close to "bin"
    // This reduces the number of multiplications needed in calculate_mask_curve
    // The masking contribution at faraway bins is negligeable

    // Another optimization to save memory and speed up the calculation of the
    // spread table is to calculate and store only 2 spread functions per
    // octave, and reuse the same spread function for multiple bins.
    int table_index = 0;
    int bin = 0;
    int increment = 1;
    while (bin < this->num_psy_bins) {
        float sum = 0;
        int base_idx = table_index * this->num_psy_bins;
        int start_bin = bin * 3 / 4;
        int end_bin = std::min(this->num_psy_bins, ((bin + 1) * 4 + 2) / 3);

        for (int j = start_bin; j < end_bin; j++) {
            // add 0.5 so i=0 doesn't get log(0)
            float rel_idx_log = std::abs(log((j + 0.5) / (bin + 0.5)));
            float value;
            if (j >= bin) {
                // mask up
                value = exp(-rel_idx_log * 40);
            } else {
                // mask down
                value = exp(-rel_idx_log * 80);
            }
            // the spreading function is centred in the row
            sum += value;
            this->spread_table[base_idx + this->num_psy_bins / 2 + j - bin] = value;
        }
        // now normalize it
        for (int j = start_bin; j < end_bin; j++) {
            this->spread_table[base_idx + this->num_psy_bins / 2 + j - bin] /= sum;
        }

        this->spread_table_range[table_index] = std::make_pair(start_bin - bin, end_bin - bin);

        int next_bin;
        if (bin <= 1) {
            next_bin = bin + 1;
        } else {
            if ((bin & (bin - 1)) == 0) {
                // power of 2
                increment = bin / 2;
            }
            next_bin = bin + increment;
        }

        // set bins between "bin" and "next_bin" to use this table_index
        for (int i = bin; i < next_bin; i++) {
            this->spread_table_index[i] = table_index;
        }

        bin = next_bin;
        table_index++;
    }
}